

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int evfilt_signal_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *x)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  filter *in_R8;
  int sigfd;
  int in_stack_00000054;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  int local_4;
  
  uVar2 = *(undefined4 *)(in_RCX + 0x10);
  signalfd_reset(in_stack_00000054);
  *in_RDI = *in_RCX;
  in_RDI[1] = in_RCX[1];
  in_RDI[2] = in_RCX[2];
  in_RDI[3] = in_RCX[3];
  in_RDI[2] = 1;
  iVar1 = knote_copyout_flag_actions(in_R8,(knote *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
evfilt_signal_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *x UNUSED)
{
    int sigfd;

    sigfd = src->kn_signalfd;

    signalfd_reset(sigfd);

    memcpy(dst, &src->kev, sizeof(*dst));
    /* NOTE: dst->data should be the number of times the signal occurred,
       but that information is not available.
     */
    dst->data = 1;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}